

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
UnsafeArenaAddAllocated<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *value)

{
  int iVar1;
  undefined8 *puVar2;
  Rep *pRVar3;
  int iVar4;
  
  pRVar3 = this->rep_;
  if (pRVar3 == (Rep *)0x0) {
    iVar4 = this->total_size_;
LAB_0032cdc6:
    Reserve(this,iVar4 + 1);
  }
  else {
    iVar4 = this->current_size_;
    if (iVar4 == this->total_size_) goto LAB_0032cdc6;
    iVar1 = pRVar3->allocated_size;
    if (iVar1 == this->total_size_) {
      if (this->arena_ == (Arena *)0x0) {
        puVar2 = (undefined8 *)pRVar3->elements[iVar4];
        if (puVar2 != (undefined8 *)0x0) {
          if ((long *)*puVar2 != puVar2 + 2) {
            operator_delete((long *)*puVar2,puVar2[2] + 1);
          }
        }
        operator_delete(puVar2,0x20);
        pRVar3 = this->rep_;
      }
      goto LAB_0032cdd6;
    }
    if (iVar1 <= iVar4) {
      pRVar3->allocated_size = iVar1 + 1;
      goto LAB_0032cdd6;
    }
    pRVar3->elements[iVar1] = pRVar3->elements[iVar4];
  }
  pRVar3 = this->rep_;
  pRVar3->allocated_size = pRVar3->allocated_size + 1;
LAB_0032cdd6:
  iVar4 = this->current_size_;
  this->current_size_ = iVar4 + 1;
  pRVar3->elements[iVar4] = value;
  return;
}

Assistant:

void RepeatedPtrFieldBase::UnsafeArenaAddAllocated(
    typename TypeHandler::Type* value) {
  // Make room for the new pointer.
  if (!rep_ || current_size_ == total_size_) {
    // The array is completely full with no cleared objects, so grow it.
    Reserve(total_size_ + 1);
    ++rep_->allocated_size;
  } else if (rep_->allocated_size == total_size_) {
    // There is no more space in the pointer array because it contains some
    // cleared objects awaiting reuse.  We don't want to grow the array in this
    // case because otherwise a loop calling AddAllocated() followed by Clear()
    // would leak memory.
    TypeHandler::Delete(
        cast<TypeHandler>(rep_->elements[current_size_]), arena_);
  } else if (current_size_ < rep_->allocated_size) {
    // We have some cleared objects.  We don't care about their order, so we
    // can just move the first one to the end to make space.
    rep_->elements[rep_->allocated_size] = rep_->elements[current_size_];
    ++rep_->allocated_size;
  } else {
    // There are no cleared objects.
    ++rep_->allocated_size;
  }

  rep_->elements[current_size_++] = value;
}